

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O1

string * __thiscall
spirv_cross::ParsedIR::get_decoration_string_abi_cxx11_(ParsedIR *this,ID id,Decoration decoration)

{
  Meta *pMVar1;
  ulong uVar2;
  Decoration local_1c;
  
  pMVar1 = find_meta(this,id);
  if (pMVar1 != (Meta *)0x0) {
    if (decoration < 0x40) {
      uVar2 = 1L << ((byte)decoration & 0x3f) & (pMVar1->decoration).decoration_flags.lower;
    }
    else {
      local_1c = decoration;
      uVar2 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(pMVar1->decoration).decoration_flags.higher._M_h,&local_1c);
    }
    if (uVar2 != 0) {
      if (decoration == DecorationUserTypeGOOGLE) {
        return &(pMVar1->decoration).user_type;
      }
      if (decoration == DecorationHlslSemanticGOOGLE) {
        return &(pMVar1->decoration).hlsl_semantic;
      }
    }
  }
  return &this->empty_string;
}

Assistant:

const string &ParsedIR::get_decoration_string(ID id, Decoration decoration) const
{
	auto *m = find_meta(id);
	if (!m)
		return empty_string;

	auto &dec = m->decoration;

	if (!dec.decoration_flags.get(decoration))
		return empty_string;

	switch (decoration)
	{
	case DecorationHlslSemanticGOOGLE:
		return dec.hlsl_semantic;

	case DecorationUserTypeGOOGLE:
		return dec.user_type;

	default:
		return empty_string;
	}
}